

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  Status stat;
  long lVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  pointer pnVar4;
  pointer pnVar5;
  byte bVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  
  bVar6 = 0;
  stat = ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.stat)->data[i];
  if (this->theRep * stat < 1) {
    test(&local_a0,this,i,stat);
    pnVar4 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar3 = &local_a0;
    pnVar5 = pnVar4 + i;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pnVar5->m_backend).data._M_elems[0] = (pnVar3->m_backend).data._M_elems[0];
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar6 * -2 + 1) * 4);
      pnVar5 = (pointer)((long)pnVar5 + ((ulong)bVar6 * -2 + 1) * 4);
    }
    pnVar4[i].m_backend.exp = local_a0.m_backend.exp;
    pnVar4[i].m_backend.neg = local_a0.m_backend.neg;
    pnVar4[i].m_backend.fpclass = local_a0.m_backend.fpclass;
    pnVar4[i].m_backend.prec_elem = local_a0.m_backend.prec_elem;
    pnVar4 = pnVar4 + i;
    pnVar3 = __return_storage_ptr__;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pnVar3->m_backend).data._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
      pnVar4 = (pointer)((long)pnVar4 + ((ulong)bVar6 * -2 + 1) * 4);
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar6 * -2 + 1) * 4);
    }
  }
  else {
    pnVar4 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar4[i].m_backend,0);
    pcVar2 = &pnVar4[i].m_backend;
    pnVar3 = __return_storage_ptr__;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pnVar3->m_backend).data._M_elems[0] = (pcVar2->data)._M_elems[0];
      pcVar2 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar2 + (ulong)bVar6 * -8 + 4);
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar6 * -2 + 1) * 4);
    }
    local_a0.m_backend.exp = pnVar4[i].m_backend.exp;
    local_a0.m_backend.neg = pnVar4[i].m_backend.neg;
    local_a0.m_backend.fpclass = pnVar4[i].m_backend.fpclass;
    local_a0.m_backend.prec_elem = pnVar4[i].m_backend.prec_elem;
  }
  (__return_storage_ptr__->m_backend).exp = local_a0.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = local_a0.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_a0.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_a0.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}